

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

ZSobolSampler *
pbrt::ZSobolSampler::Create
          (ParameterDictionary *parameters,Point2i fullResolution,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  int samplesPerPixel;
  RandomizeStrategy randomizeStrategy;
  string s;
  string local_a8;
  int local_84;
  FileLoc *local_80;
  Tuple2<pbrt::Point2,_int> local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"pixelsamples","");
  iVar2 = ParameterDictionary::GetOneInt(parameters,&local_a8,0x10);
  local_78 = fullResolution.super_Tuple2<pbrt::Point2,_int>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((char)Options[8] == '\x01') {
    iVar2 = Options[7];
  }
  samplesPerPixel = 1;
  if ((char)Options[0xb] == '\0') {
    samplesPerPixel = iVar2;
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_80 = loc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"seed","");
  local_84 = ParameterDictionary::GetOneInt(parameters,&local_a8,*Options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"randomization","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fastowen","");
  ParameterDictionary::GetOneString(&local_a8,parameters,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_a8);
  if (iVar2 == 0) {
    randomizeStrategy = None;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar2 == 0) {
      randomizeStrategy = CranleyPatterson;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar2 == 0) {
        randomizeStrategy = PermuteDigits;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar2 == 0) {
          randomizeStrategy = FastOwen;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_a8);
          randomizeStrategy = Owen;
          if (iVar2 != 0) {
            ErrorExit<std::__cxx11::string&>
                      (local_80,"%s: unknown randomization strategy given to ZSobolSampler",
                       &local_a8);
          }
        }
      }
    }
  }
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  ZSobolSampler((ZSobolSampler *)CONCAT44(extraout_var,iVar2),samplesPerPixel,(Point2i)local_78,
                randomizeStrategy,local_84);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return (ZSobolSampler *)CONCAT44(extraout_var,iVar2);
}

Assistant:

ZSobolSampler *ZSobolSampler::Create(const ParameterDictionary &parameters,
                                     Point2i fullResolution, const FileLoc *loc,
                                     Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to ZSobolSampler", s);

    return alloc.new_object<ZSobolSampler>(nsamp, fullResolution, randomizer, seed);
}